

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS ref_cell_compact(REF_CELL ref_cell,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  REF_INT *pRVar1;
  bool bVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  int iVar6;
  int *piVar7;
  undefined8 uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  
  if ((long)ref_cell->max < 0) {
    bVar2 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x357,
           "ref_cell_compact","malloc *o2n_ptr of REF_INT negative");
    RVar3 = 1;
  }
  else {
    pRVar4 = (REF_INT *)malloc((long)ref_cell->max << 2);
    *o2n_ptr = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x357,
             "ref_cell_compact","malloc *o2n_ptr of REF_INT NULL");
      RVar3 = 2;
    }
    else {
      bVar2 = true;
      if (0 < (long)ref_cell->max) {
        pRVar4 = (REF_INT *)memset(pRVar4,0xff,(long)ref_cell->max << 2);
      }
      RVar3 = (REF_STATUS)pRVar4;
    }
  }
  if (!bVar2) {
    return RVar3;
  }
  if ((long)ref_cell->n < 0) {
    pcVar12 = "malloc *n2o_ptr of REF_INT negative";
    uVar8 = 0x359;
  }
  else {
    pRVar4 = *o2n_ptr;
    pRVar5 = (REF_INT *)malloc((long)ref_cell->n << 2);
    *n2o_ptr = pRVar5;
    if (pRVar5 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x359,
             "ref_cell_compact","malloc *n2o_ptr of REF_INT NULL");
      return 2;
    }
    uVar10 = ref_cell->max;
    if ((int)uVar10 < 1) {
      iVar6 = 0;
    }
    else {
      pRVar1 = ref_cell->c2n;
      lVar9 = 0;
      iVar6 = 0;
      do {
        if (pRVar1[(long)(int)lVar9 * (long)ref_cell->size_per] != -1) {
          pRVar4[lVar9] = iVar6;
          iVar6 = iVar6 + 1;
        }
        lVar9 = lVar9 + 1;
        uVar10 = ref_cell->max;
      } while (lVar9 < (int)uVar10);
    }
    if (iVar6 == ref_cell->n) {
      if (0 < (int)uVar10) {
        piVar7 = ref_cell->c2n;
        iVar6 = ref_cell->size_per;
        uVar11 = 0;
        do {
          if (*piVar7 != -1) {
            pRVar5[pRVar4[uVar11]] = (REF_INT)uVar11;
          }
          uVar11 = uVar11 + 1;
          piVar7 = piVar7 + iVar6;
        } while (uVar10 != uVar11);
      }
      return 0;
    }
    pcVar12 = "ncell miscount";
    uVar8 = 0x363;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar8,
         "ref_cell_compact",pcVar12);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_compact(REF_CELL ref_cell, REF_INT **o2n_ptr,
                                    REF_INT **n2o_ptr) {
  REF_INT cell;
  REF_INT ncell;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_cell_n(ref_cell), REF_INT);
  n2o = *n2o_ptr;

  ncell = 0;

  each_ref_cell_valid_cell(ref_cell, cell) {
    o2n[cell] = ncell;
    ncell++;
  }

  RES(ncell, ref_cell_n(ref_cell), "ncell miscount");

  each_ref_cell_valid_cell(ref_cell, cell) n2o[o2n[cell]] = cell;

  return REF_SUCCESS;
}